

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_functional_test.cc
# Opt level: O2

void iterator_compact_uncommitted_db(void)

{
  fdb_kvs_handle *pfVar1;
  fdb_status fVar2;
  size_t sVar3;
  size_t sVar4;
  int iVar5;
  uint uVar6;
  char *__format;
  fdb_iterator *it;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  timeval __test_begin;
  fdb_kvs_config kvs_config;
  char bodybuf [256];
  char keybuf [256];
  fdb_config fconfig;
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  memleak_start();
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fconfig.wal_threshold = 0x400;
  fconfig.seqtree_opt = '\x01';
  fconfig.flags = 1;
  system("rm -rf  iterator_test* > errorlog.txt");
  fdb_open(&dbfile,"./iterator_test1",&fconfig);
  fdb_kvs_open(dbfile,&db,"db1",&kvs_config);
  for (uVar6 = 0; uVar6 != 10; uVar6 = uVar6 + 1) {
    sprintf(keybuf,"key%d",(ulong)uVar6);
    sprintf(bodybuf,"body%d",(ulong)uVar6);
    pfVar1 = db;
    sVar3 = strlen(keybuf);
    sVar4 = strlen(bodybuf);
    fdb_set_kv(pfVar1,keybuf,sVar3,bodybuf,sVar4);
  }
  fVar2 = fdb_iterator_sequence_init(db,&it,0,0,0);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x1c3);
    iterator_compact_uncommitted_db()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x1c3,"void iterator_compact_uncommitted_db()");
  }
  iVar5 = 10;
  do {
    fVar2 = fdb_iterator_next(it);
    iVar5 = iVar5 + -1;
  } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
  fdb_iterator_close(it);
  if (iVar5 != 0) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x1c8);
    iterator_compact_uncommitted_db()::__test_pass = 1;
    __assert_fail("i == n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x1c8,"void iterator_compact_uncommitted_db()");
  }
  fdb_compact(dbfile,(char *)0x0);
  for (uVar6 = 0; uVar6 != 10; uVar6 = uVar6 + 1) {
    sprintf(keybuf,"key%d",(ulong)uVar6);
    sprintf(bodybuf,"body%d",(ulong)uVar6);
    pfVar1 = db;
    sVar3 = strlen(keybuf);
    sVar4 = strlen(bodybuf);
    fdb_set_kv(pfVar1,keybuf,sVar3,bodybuf,sVar4);
  }
  fVar2 = fdb_iterator_sequence_init(db,&it,0,0,0);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x1d7);
    iterator_compact_uncommitted_db()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x1d7,"void iterator_compact_uncommitted_db()");
  }
  iVar5 = 10;
  do {
    fVar2 = fdb_iterator_next(it);
    iVar5 = iVar5 + -1;
  } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
  fdb_iterator_close(it);
  if (iVar5 == 0) {
    fdb_kvs_close(db);
    fdb_close(dbfile);
    fdb_shutdown();
    memleak_end();
    __format = "%s PASSED\n";
    if (iterator_compact_uncommitted_db()::__test_pass != '\0') {
      __format = "%s FAILED\n";
    }
    fprintf(_stderr,__format,"iterator compact uncommitted db");
    return;
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
          ,0x1dc);
  iterator_compact_uncommitted_db()::__test_pass = 1;
  __assert_fail("i == n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                ,0x1dc,"void iterator_compact_uncommitted_db()");
}

Assistant:

void iterator_compact_uncommitted_db()
{
    TEST_INIT();
    memleak_start();

    int i, r;
    int n = 10;
    char keybuf[256], bodybuf[256];
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_status status;
    fdb_iterator *it;
    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.wal_threshold = 1024;
    fconfig.seqtree_opt = FDB_SEQTREE_USE; // enable seqtree since get_byseq
    fconfig.flags = FDB_OPEN_FLAG_CREATE;

    // remove previous iterator_test files
    r = system(SHELL_DEL" iterator_test* > errorlog.txt");
    (void)r;

    // open db
    fdb_open(&dbfile, "./iterator_test1", &fconfig);
    fdb_kvs_open(dbfile, &db, "db1", &kvs_config);


    // set docs
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_set_kv(db, keybuf, strlen(keybuf),
                bodybuf, strlen(bodybuf));
    }

    // count number of iteratable docs
    status = fdb_iterator_sequence_init(db, &it, 0, 0, FDB_ITR_NONE);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    i=0;
    do { ++i; }
    while (fdb_iterator_next(it) != FDB_RESULT_ITERATOR_FAIL);
    fdb_iterator_close(it);
    TEST_CHK(i == n);

    // compact
    fdb_compact(dbfile, NULL);

    // set again
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_set_kv(db, keybuf, strlen(keybuf),
                bodybuf, strlen(bodybuf));
    }

    // count number of iteratable docs
    status = fdb_iterator_sequence_init(db, &it, 0, 0, FDB_ITR_NONE);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    i=0;
    do { ++i; }
    while (fdb_iterator_next(it) != FDB_RESULT_ITERATOR_FAIL);
    fdb_iterator_close(it);
    TEST_CHK(i == n);


    fdb_kvs_close(db);
    fdb_close(dbfile);
    fdb_shutdown();

    memleak_end();
    TEST_RESULT("iterator compact uncommitted db");
}